

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.c
# Opt level: O0

stumpless_entry *
vstumpless_load_entry
          (stumpless_entry *entry,stumpless_facility facility,stumpless_severity severity,
          char *app_name,char *msgid,char *message,__va_list_tag *subs)

{
  stumpless_entry *psVar1;
  stumpless_entry *result;
  size_t msg_length;
  char *msg;
  char *message_local;
  char *msgid_local;
  char *app_name_local;
  stumpless_severity severity_local;
  stumpless_facility facility_local;
  stumpless_entry *entry_local;
  
  msg = message;
  message_local = msgid;
  msgid_local = app_name;
  app_name_local._0_4_ = severity;
  app_name_local._4_4_ = facility;
  _severity_local = entry;
  if (message == (char *)0x0) {
    msg_length = 0;
    result = (stumpless_entry *)0x0;
  }
  else {
    msg_length = (size_t)no_vsnprintf_s_format_string(message,subs,(size_t *)&result);
    if ((char *)msg_length == (char *)0x0) {
      return (stumpless_entry *)0x0;
    }
  }
  clear_error();
  psVar1 = unchecked_load_entry
                     (_severity_local,app_name_local._4_4_,(stumpless_severity)app_name_local,
                      msgid_local,message_local,(char *)msg_length,(size_t)result);
  if (psVar1 == (stumpless_entry *)0x0) {
    free_mem((void *)msg_length);
  }
  return psVar1;
}

Assistant:

struct stumpless_entry *
vstumpless_load_entry( struct stumpless_entry *entry,
                       enum stumpless_facility facility,
                       enum stumpless_severity severity,
                       const char *app_name,
                       const char *msgid,
                       const char *message,
                       va_list subs ) {
  char *msg;
  size_t msg_length;
  struct stumpless_entry *result;

  if( message ) {
    msg = config_format_string( message, subs, &msg_length );
    if( !msg ) {
      return NULL;
    }

  } else {
    msg = NULL;
    msg_length = 0;
  }

  clear_error(  );
  result = unchecked_load_entry( entry,
                                 facility,
                                 severity,
                                 app_name,
                                 msgid,
                                 msg,
                                 msg_length );

  if( !result ) {
    free_mem( msg );
  }

  return result;
}